

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  GCObject *t_00;
  Table *events;
  Value *pVVar1;
  int iVar2;
  TValue *pTVar3;
  Value *pVVar4;
  StkId pTVar5;
  TValue *o2_2;
  TValue *o1;
  TValue *o2_1;
  int iVar6;
  TValue temp;
  Value local_40;
  int local_38;
  
  iVar2 = t->tt;
  iVar6 = 100;
  do {
    if (iVar2 == 5) {
      t_00 = *(GCObject **)t;
      pTVar3 = luaH_set(L,&t_00->h,key);
      if ((((pTVar3->tt != 0) || (events = (t_00->h).metatable, events == (Table *)0x0)) ||
          ((events->flags & 2) != 0)) ||
         (pVVar4 = &luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1])->value, pVVar4 == (Value *)0x0)
         ) {
        pTVar3->value = val->value;
        iVar2 = val->tt;
        pTVar3->tt = iVar2;
        (t_00->h).flags = '\0';
        if (iVar2 < 4) {
          return;
        }
        if (((((val->value).gc)->gch).marked & 3) == 0) {
          return;
        }
        if (((t_00->gch).marked & 4) == 0) {
          return;
        }
        luaC_barrierback(L,&t_00->h);
        return;
      }
    }
    else {
      pVVar4 = &luaT_gettmbyobj(L,t,TM_NEWINDEX)->value;
      if (pVVar4[1].b == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    iVar2 = pVVar4[1].b;
    if (iVar2 == 6) {
      pVVar1 = &L->top->value;
      *pVVar1 = *pVVar4;
      pVVar1[1].b = pVVar4[1].b;
      pTVar5 = L->top;
      pTVar5[1].value = t->value;
      pTVar5[1].tt = ((Value *)((long)t + 8))->b;
      pTVar5 = L->top;
      pTVar5[2].value = key->value;
      pTVar5[2].tt = key->tt;
      pTVar5 = L->top;
      pTVar5[3].value = val->value;
      pTVar5[3].tt = val->tt;
      pTVar5 = L->top;
      if ((long)L->stack_last - (long)pTVar5 < 0x41) {
        luaD_growstack(L,4);
        pTVar5 = L->top;
      }
      L->top = pTVar5 + 4;
      luaD_call(L,pTVar5,0);
      return;
    }
    local_40 = *pVVar4;
    local_38 = iVar2;
    t = (TValue *)&local_40;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  luaG_runerror(L,"loop in settable");
  return;
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  int loop;
  TValue temp;
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;
    if (ttistable(t)) {  /* `t' is a table? */
      Table *h = hvalue(t);
      TValue *oldval = luaH_set(L, h, key); /* do a primitive set */
      if (!ttisnil(oldval) ||  /* result is no nil? */
          (tm = fasttm(L, h->metatable, TM_NEWINDEX)) == NULL) { /* or no TM? */
        setobj2t(L, oldval, val);
        h->flags = 0;
        luaC_barriert(L, h, val);
        return;
      }
      /* else will try the tag method */
    }
    else if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
      luaG_typeerror(L, t, "index");
    if (ttisfunction(tm)) {
      callTM(L, tm, t, key, val);
      return;
    }
    /* else repeat with `tm' */
    setobj(L, &temp, tm);  /* avoid pointing inside table (may rehash) */
    t = &temp;
  }
  luaG_runerror(L, "loop in settable");
}